

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void cxxopts::values::parse_value<std::__cxx11::string>
               (string *text,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  istream *piVar1;
  long lVar2;
  ostream *poVar3;
  argument_incorrect_type *this;
  istringstream is;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)text,_S_in);
  piVar1 = std::operator>>((istream *)&is,(string *)value);
  if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) == 0) {
    lVar2 = std::streambuf::in_avail();
    if (lVar2 == 0) {
      std::__cxx11::istringstream::~istringstream((istringstream *)&is);
      return;
    }
    this = (argument_incorrect_type *)__cxa_allocate_exception(0x28);
    argument_incorrect_type::argument_incorrect_type(this,text);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"cannot parse empty value");
    std::endl<char,std::char_traits<char>>(poVar3);
    this = (argument_incorrect_type *)__cxa_allocate_exception(0x28);
    argument_incorrect_type::argument_incorrect_type(this,text);
  }
  __cxa_throw(this,&argument_incorrect_type::typeinfo,OptionException::~OptionException);
}

Assistant:

void
    parse_value(const std::string& text, T& value)
    {
      std::istringstream is(text);
      if (!(is >> value))
      {
        std::cerr << "cannot parse empty value" << std::endl;
        throw argument_incorrect_type(text);
      }

      if (is.rdbuf()->in_avail() != 0)
      {
        throw argument_incorrect_type(text);
      }
    }